

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O1

Var Js::HelperMethodWrapper6
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebuggingFlags *this;
  Var pvVar4;
  AutoRegisterIgnoreExceptionWrapper local_58;
  code *local_50;
  Var local_48;
  Var local_40;
  undefined4 *local_38;
  
  local_48 = arg6;
  local_50 = (code *)origHelperAddr;
  local_40 = arg3;
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = (undefined4 *)arg4;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x7a,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) goto LAB_008ba345;
    *puVar3 = 0;
    arg4 = local_38;
  }
  this = DebugManager::GetDebuggingFlags(scriptContext->threadContext->debugManager);
  bVar2 = DebuggingFlags::IsBuiltInWrapperPresent(this);
  if (bVar2) {
    pvVar4 = (Var)(*local_50)(arg1,arg2,local_40,arg4,arg5,local_48);
    return pvVar4;
  }
  AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
            (&local_58,scriptContext->threadContext);
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *local_38 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/DiagHelperMethodWrapper.h"
                                ,0x31,"(scriptContext)","scriptContext");
    if (!bVar2) {
LAB_008ba345:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *local_38 = 0;
  }
  pvVar4 = (Var)(*local_50)(arg1,arg2,local_40,arg4,arg5,local_48);
  AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_58);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper6(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod6)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6);
        });
    }